

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               int nthreads)

{
  iterator iVar1;
  iterator iVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  reference pvVar9;
  unsigned_long *puVar10;
  reference pvVar11;
  long in_RCX;
  long in_RDX;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_RSI;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_RDI;
  size_t row_1;
  size_t node_1;
  size_t tree_1;
  size_t row;
  size_t node;
  size_t tree;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree_mapping;
  size_t curr_term;
  size_t max_tree;
  size_t ntrees;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_fffffffffffffeb8;
  unsigned_long *in_stack_fffffffffffffec0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee0;
  size_type local_100;
  ulong local_f8;
  unsigned_long *local_f0;
  ulong local_d0;
  ulong local_b0;
  ulong local_a8;
  ulong local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long *local_40;
  unsigned_long local_38;
  size_type local_30;
  long local_20;
  long local_18;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *local_10;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI == (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)0x0) {
    local_100 = std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::size(in_RSI);
  }
  else {
    local_100 = std::
                vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ::size(in_RDI);
  }
  local_30 = local_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x606f3a);
  if (local_8 ==
      (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
       *)0x0) {
    iVar7 = std::
            vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            ::begin(in_stack_fffffffffffffeb8);
    iVar8 = std::
            vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            ::end(in_stack_fffffffffffffeb8);
    local_38 = std::
               accumulate<__gnu_cxx::__normal_iterator<std::vector<IsoHPlane,std::allocator<IsoHPlane>>*,std::vector<std::vector<IsoHPlane,std::allocator<IsoHPlane>>,std::allocator<std::vector<IsoHPlane,std::allocator<IsoHPlane>>>>>,unsigned_long,remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>(IsoForest*,ExtIsoForest*,PredictionData<float,unsigned_long>&,unsigned_long*,int)::_lambda(unsigned_long,std::vector<IsoHPlane,std::allocator<IsoHPlane>>const&)_1_>
                         (iVar7._M_current,iVar8._M_current,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_fffffffffffffee0,local_38);
    for (local_d0 = 0; local_d0 < local_30; local_d0 = local_d0 + 1) {
      in_stack_fffffffffffffed0._M_current = (unsigned_long *)&local_58;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb8)
      ;
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      local_40 = (unsigned_long *)0x0;
      local_f0 = (unsigned_long *)0x0;
      while( true ) {
        in_stack_fffffffffffffec8._M_current = local_f0;
        pvVar9 = std::
                 vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ::operator[](local_10,local_d0);
        puVar10 = (unsigned_long *)std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::size(pvVar9);
        if (puVar10 <= in_stack_fffffffffffffec8._M_current) break;
        pvVar9 = std::
                 vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ::operator[](local_10,local_d0);
        pvVar11 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                            (pvVar9,(size_type)local_f0);
        if (pvVar11->hplane_left == 0) {
          in_stack_fffffffffffffec0 = local_40;
          local_40 = (unsigned_long *)((long)local_40 + 1);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_58,(size_type)local_f0);
          *pvVar6 = (value_type)in_stack_fffffffffffffec0;
        }
        local_f0 = (unsigned_long *)((long)local_f0 + 1);
      }
      for (local_f8 = 0; local_f8 < *(ulong *)(local_18 + 0x10); local_f8 = local_f8 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_58,
                            *(size_type *)
                             (local_20 + (local_f8 + local_d0 * *(long *)(local_18 + 0x10)) * 8));
        *(value_type *)(local_20 + (local_f8 + local_d0 * *(long *)(local_18 + 0x10)) * 8) = *pvVar6
        ;
      }
    }
  }
  else {
    iVar1 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::begin((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)in_stack_fffffffffffffeb8);
    iVar2 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::end((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)in_stack_fffffffffffffeb8);
    local_38 = std::
               accumulate<__gnu_cxx::__normal_iterator<std::vector<IsoTree,std::allocator<IsoTree>>*,std::vector<std::vector<IsoTree,std::allocator<IsoTree>>,std::allocator<std::vector<IsoTree,std::allocator<IsoTree>>>>>,unsigned_long,remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>(IsoForest*,ExtIsoForest*,PredictionData<float,unsigned_long>&,unsigned_long*,int)::_lambda(unsigned_long,std::vector<IsoTree,std::allocator<IsoTree>>const&)_1_>
                         (iVar1._M_current,iVar2._M_current,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    for (local_88 = 0; local_88 < local_30; local_88 = local_88 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb8)
      ;
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      local_40 = (unsigned_long *)0x0;
      local_a8 = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ::operator[](local_8,local_88);
        sVar4 = std::vector<IsoTree,_std::allocator<IsoTree>_>::size(pvVar3);
        if (sVar4 <= local_a8) break;
        pvVar3 = std::
                 vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ::operator[](local_8,local_88);
        pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](pvVar3,local_a8);
        if (pvVar5->tree_left == 0) {
          puVar10 = local_40;
          local_40 = (unsigned_long *)((long)local_40 + 1);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_58,local_a8);
          *pvVar6 = (value_type)puVar10;
        }
        local_a8 = local_a8 + 1;
      }
      for (local_b0 = 0; local_b0 < *(ulong *)(local_18 + 0x10); local_b0 = local_b0 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_58,
                            *(size_type *)
                             (local_20 + (local_b0 + local_88 * *(long *)(local_18 + 0x10)) * 8));
        *(value_type *)(local_20 + (local_b0 + local_88 * *(long *)(local_18 + 0x10)) * 8) = *pvVar6
        ;
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current);
  return;
}

Assistant:

void remap_terminal_trees(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          PredictionData &prediction_data, sparse_ix *restrict tree_num, int nthreads)
{
    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    size_t max_tree, curr_term;
    std::vector<sparse_ix> tree_mapping;
    if (model_outputs != NULL)
    {
        max_tree = std::accumulate(model_outputs->trees.begin(),
                                   model_outputs->trees.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoTree> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs->trees[tree].size(); node++)
                if (model_outputs->trees[tree][node].tree_left == 0)
                    tree_mapping[node] = curr_term++;

            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }

    else
    {
        max_tree = std::accumulate(model_outputs_ext->hplanes.begin(),
                                   model_outputs_ext->hplanes.end(),
                                   (size_t)0,
                                   [](const size_t curr_max, const std::vector<IsoHPlane> &tr)
                                   {return std::max(curr_max, tr.size());});
        tree_mapping.resize(max_tree);
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            std::fill(tree_mapping.begin(), tree_mapping.end(), (size_t)0);
            curr_term = 0;
            for (size_t node = 0; node < model_outputs_ext->hplanes[tree].size(); node++)
                if (model_outputs_ext->hplanes[tree][node].hplane_left == 0)
                    tree_mapping[node] = curr_term++;
            
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(tree_num, tree_mapping, tree, prediction_data)
            for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
                tree_num[row + tree * prediction_data.nrows] = tree_mapping[tree_num[row + tree * prediction_data.nrows]];
        }
    }
}